

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O2

int i2d_SSL_SESSION(SSL_SESSION *in,uchar **pp)

{
  ulong __n;
  int iVar1;
  long lVar2;
  int iVar3;
  size_t len;
  uint8_t *out;
  
  iVar1 = SSL_SESSION_to_bytes((SSL_SESSION *)in,&out,&len);
  iVar3 = -1;
  if (iVar1 != 0) {
    __n = CONCAT44(len._4_4_,(int)len);
    if ((__n & 0xffffffff80000000) == 0) {
      if (pp != (uchar **)0x0) {
        if (__n == 0) {
          lVar2 = 0;
        }
        else {
          memcpy(*pp,out,__n);
          lVar2 = CONCAT44(len._4_4_,(int)len);
        }
        *pp = *pp + lVar2;
      }
      OPENSSL_free(out);
      iVar3 = (int)len;
    }
    else {
      OPENSSL_free(out);
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                    ,0x300);
    }
  }
  return iVar3;
}

Assistant:

int i2d_SSL_SESSION(SSL_SESSION *in, uint8_t **pp) {
  uint8_t *out;
  size_t len;

  if (!SSL_SESSION_to_bytes(in, &out, &len)) {
    return -1;
  }

  if (len > INT_MAX) {
    OPENSSL_free(out);
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return -1;
  }

  if (pp) {
    OPENSSL_memcpy(*pp, out, len);
    *pp += len;
  }
  OPENSSL_free(out);

  return len;
}